

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall
spatial_region::fill_cell_by_particles
          (spatial_region *this,double cmr,int_vector3d *a,int_vector3d *b,double n,double ux0,
          double uy0,double dsplmt,double T)

{
  int iVar1;
  int iVar2;
  int iVar3;
  particle *ppVar4;
  cellp ***pppcVar5;
  int *in_RDX;
  int *in_RSI;
  spatial_region *in_RDI;
  double in_XMM0_Qa;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar8;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  double in_XMM1_Qa;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double in_XMM2_Qa;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  double in_XMM5_Qa;
  double g;
  double v;
  double gamma;
  double r;
  double c;
  double b_1;
  double a_1;
  double v0;
  double u0;
  int kp;
  int jp;
  int ip;
  particle *tmp_p;
  double q0;
  double z0;
  double y0;
  double x0;
  int in_stack_fffffffffffffefc;
  field3d<cellp> *in_stack_ffffffffffffff00;
  particle *in_stack_ffffffffffffff08;
  spatial_region *in_stack_ffffffffffffff10;
  bool local_e1;
  spatial_region *in_stack_ffffffffffffff28;
  int local_7c;
  int local_78;
  int local_74;
  double local_68;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  iVar1 = *in_RDX;
  iVar2 = in_RDX[1];
  iVar3 = in_RDX[2];
  local_68 = (1.0 / (double)(*in_RDX * in_RDX[1] * in_RDX[2])) * in_XMM1_Qa;
  if (in_XMM0_Qa < 0.0) {
    local_68 = -local_68;
  }
  for (local_74 = 0; local_74 < *in_RDX; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < in_RDX[1]; local_78 = local_78 + 1) {
      for (local_7c = 0; local_7c < in_RDX[2]; local_7c = local_7c + 1) {
        ppVar4 = new_particle(in_stack_ffffffffffffff28);
        ppVar4->cmr = in_XMM0_Qa;
        ppVar4->q = local_68;
        ppVar4->x = 0.5 / (double)iVar1 + in_XMM4_Qa + (double)*in_RSI +
                    (double)local_74 / (double)*in_RDX;
        ppVar4->y = 0.5 / (double)iVar2 + (double)in_RSI[1] + (double)local_78 / (double)in_RDX[1];
        ppVar4->z = 0.5 / (double)iVar3 + (double)in_RSI[2] + (double)local_7c / (double)in_RDX[2];
        if (((in_XMM5_Qa == 0.0) && (!NAN(in_XMM5_Qa))) ||
           ((in_XMM0_Qa == 0.0 && (!NAN(in_XMM0_Qa))))) {
          ppVar4->ux = in_XMM2_Qa;
          ppVar4->uy = in_XMM3_Qa;
          ppVar4->uz = 0.0;
        }
        else {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = in_XMM2_Qa;
          auVar10._8_8_ = 0;
          auVar10._0_8_ = in_XMM2_Qa;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = in_XMM3_Qa * in_XMM3_Qa;
          auVar10 = vfmadd213sd_fma(auVar10,auVar28,auVar44);
          auVar11._0_8_ = (spatial_region *)sqrt(auVar10._0_8_);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = auVar11._0_8_;
          auVar11._8_8_ = 0;
          auVar10 = vfmadd213sd_fma(auVar11,auVar29,ZEXT816(0x3ff0000000000000));
          in_stack_ffffffffffffff28 = auVar11._0_8_;
          dVar9 = sqrt(auVar10._0_8_);
          auVar15._0_8_ = (double)in_stack_ffffffffffffff28 / dVar9;
          do {
            dVar9 = get_rand(in_RDI);
            auVar12._8_8_ = 0;
            auVar12._0_8_ = in_XMM5_Qa;
            auVar30._8_8_ = 0;
            auVar30._0_8_ = dVar9 * 5.0;
            auVar10 = vfmadd213sd_fma(auVar12,auVar30,ZEXT816(0x3ff0000000000000));
            dVar9 = auVar10._0_8_;
            dVar6 = get_rand(in_RDI);
            dVar7 = exp(-(dVar9 - 1.0) / in_XMM5_Qa);
          } while (dVar7 < dVar6);
          do {
            auVar25._0_8_ = get_rand(in_RDI);
            auVar25._8_56_ = extraout_var;
            auVar10 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar25._0_16_,
                                      ZEXT816(0xbff0000000000000));
            auVar13._0_8_ = auVar10._0_8_;
            auVar26._0_8_ = get_rand(in_RDI);
            auVar26._8_56_ = extraout_var_00;
            auVar10 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar26._0_16_,
                                      ZEXT816(0xbff0000000000000));
            dVar6 = auVar10._0_8_;
            auVar27._0_8_ = get_rand(in_RDI);
            auVar27._8_56_ = extraout_var_01;
            auVar10 = vfmadd213sd_fma(ZEXT816(0x4000000000000000),auVar27._0_16_,
                                      ZEXT816(0xbff0000000000000));
            auVar14._0_8_ = auVar10._0_8_;
            auVar13._8_8_ = 0;
            auVar45._8_8_ = 0;
            auVar45._0_8_ = auVar13._0_8_;
            auVar31._8_8_ = 0;
            auVar31._0_8_ = dVar6 * dVar6;
            auVar10 = vfmadd213sd_fma(auVar45,auVar13,auVar31);
            auVar32._8_8_ = 0;
            auVar32._0_8_ = auVar14._0_8_;
            auVar14._8_8_ = 0;
            auVar10 = vfmadd213sd_fma(auVar14,auVar32,auVar10);
            dVar7 = sqrt(auVar10._0_8_);
            local_e1 = 1.0 < dVar7 || dVar7 == 0.0;
          } while (local_e1);
          dVar8 = sqrt(1.0 - 1.0 / (dVar9 * dVar9));
          dVar9 = dVar8 * (auVar13._0_8_ / dVar7);
          in_stack_ffffffffffffff08 = (particle *)(dVar8 * (dVar6 / dVar7));
          in_stack_ffffffffffffff10 = (spatial_region *)(dVar8 * (auVar14._0_8_ / dVar7));
          auVar15._8_8_ = 0;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = -auVar15._0_8_;
          auVar10 = vfmadd213sd_fma(auVar15,auVar33,ZEXT816(0x3ff0000000000000));
          dVar6 = sqrt(auVar10._0_8_);
          auVar46._8_8_ = 0;
          auVar46._0_8_ = dVar9;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = auVar15._0_8_;
          auVar10 = vfmadd213sd_fma(auVar34,auVar46,ZEXT816(0x3ff0000000000000));
          dVar6 = ((double)in_stack_ffffffffffffff08 * dVar6) / auVar10._0_8_;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = auVar15._0_8_;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = -auVar15._0_8_;
          auVar10 = vfmadd213sd_fma(auVar16,auVar35,ZEXT816(0x3ff0000000000000));
          dVar7 = sqrt(auVar10._0_8_);
          auVar47._8_8_ = 0;
          auVar47._0_8_ = dVar9;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = auVar15._0_8_;
          auVar10 = vfmadd213sd_fma(auVar36,auVar47,ZEXT816(0x3ff0000000000000));
          auVar19._0_8_ = ((double)in_stack_ffffffffffffff10 * dVar7) / auVar10._0_8_;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = dVar9;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = auVar15._0_8_;
          auVar10 = vfmadd213sd_fma(auVar37,auVar48,ZEXT816(0x3ff0000000000000));
          dVar9 = (dVar9 + auVar15._0_8_) / auVar10._0_8_;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = dVar9;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = -dVar9;
          auVar10 = vfmadd213sd_fma(auVar38,auVar17,ZEXT816(0x3ff0000000000000));
          auVar49._8_8_ = 0;
          auVar49._0_8_ = dVar6;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = -dVar6;
          auVar10 = vfmadd213sd_fma(auVar49,auVar18,auVar10);
          auVar19._8_8_ = 0;
          auVar39._8_8_ = 0;
          auVar39._0_8_ = -auVar19._0_8_;
          auVar10 = vfmadd213sd_fma(auVar19,auVar39,auVar10);
          dVar7 = sqrt(auVar10._0_8_);
          dVar7 = 1.0 / dVar7;
          ppVar4->ux = (dVar9 * dVar7 * in_XMM2_Qa) / (double)auVar11._0_8_ -
                       (dVar6 * dVar7 * in_XMM3_Qa) / (double)auVar11._0_8_;
          ppVar4->uy = (dVar9 * dVar7 * in_XMM3_Qa) / (double)auVar11._0_8_ +
                       (dVar6 * dVar7 * in_XMM2_Qa) / (double)auVar11._0_8_;
          ppVar4->uz = auVar19._0_8_ * dVar7;
        }
        if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
          auVar20._8_8_ = 0;
          auVar20._0_8_ = ppVar4->ux;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = ppVar4->ux;
          auVar10 = vfmadd213sd_fma(auVar40,auVar20,ZEXT816(0x3ff0000000000000));
          auVar21._8_8_ = 0;
          auVar21._0_8_ = ppVar4->uy;
          auVar50._8_8_ = 0;
          auVar50._0_8_ = ppVar4->uy;
          auVar10 = vfmadd213sd_fma(auVar50,auVar21,auVar10);
          auVar41._8_8_ = 0;
          auVar41._0_8_ = ppVar4->uz;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = ppVar4->uz;
          auVar10 = vfmadd213sd_fma(auVar22,auVar41,auVar10);
          dVar9 = sqrt(auVar10._0_8_);
          ppVar4->g = dVar9;
        }
        else {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = ppVar4->ux;
          auVar51._8_8_ = 0;
          auVar51._0_8_ = ppVar4->ux;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = ppVar4->uy * ppVar4->uy;
          auVar10 = vfmadd213sd_fma(auVar51,auVar23,auVar42);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = ppVar4->uz;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = ppVar4->uz;
          auVar10 = vfmadd213sd_fma(auVar24,auVar43,auVar10);
          dVar9 = sqrt(auVar10._0_8_);
          ppVar4->g = dVar9;
        }
        ppVar4->chi = 0.0;
        ppVar4->trn = 0;
        place(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      }
    }
  }
  pppcVar5 = field3d<cellp>::operator[](in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  ppVar4 = (*pppcVar5)[in_RSI[1]][in_RSI[2]].pl.head;
  pppcVar5 = field3d<cellp>::operator[]((field3d<cellp> *)ppVar4,in_stack_fffffffffffffefc);
  (*pppcVar5)[in_RSI[1]][in_RSI[2]].pl.start = ppVar4;
  return;
}

Assistant:

void spatial_region::fill_cell_by_particles(double cmr, int_vector3d& a, int_vector3d& b, double n, double ux0, double uy0, double dsplmt, double T)
{
    // a = {i,j,k} - cell position, b = {xnpic,ynpic,znpic}, n - density
    double x0;
    double y0;
    double z0;
    double q0;
    particle* tmp_p;
    x0 = 0.5/b.i + dsplmt;
    y0 = 0.5/b.j;
    z0 = 0.5/b.k;
    q0 = 1/double(b.i*b.j*b.k)*n;
    if (cmr<0) q0 = -q0;
    for(int ip=0;ip<b.i;ip++)
    {
        for(int jp=0;jp<b.j;jp++)
        {
            for(int kp=0;kp<b.k;kp++)
            {
                tmp_p = new_particle();
                // initial conditions
                tmp_p->cmr = cmr;
                tmp_p->q = q0;
                tmp_p->x = x0 + double(a.i) + double(ip)/double(b.i);
                tmp_p->y = y0 + double(a.j) + double(jp)/double(b.j);
                tmp_p->z = z0 + double(a.k) + double(kp)/double(b.k);
                if ( T!=0 && cmr!=0 ){
                    double u0 = sqrt( ux0*ux0 + uy0*uy0 );
                    double v0 = u0 / sqrt( 1 + u0*u0 );
                    double a, b, c, r, gamma, v;
                    // gives gamma with approximately e^(-(x-1)/T) distribution
                    do {
                        gamma = 1 + get_rand() * 5 * T;
                    } while ( get_rand() > exp( -(gamma - 1) / T));
                    // gives random direction (uniform)
                    do {
                        a = 2*get_rand()-1;
                        b = 2*get_rand()-1;
                        c = 2*get_rand()-1;
                        r = sqrt( a*a + b*b + c*c );
                    } while ( r > 1 || r == 0);
                    a = a / r;
                    b = b / r;
                    c = c / r;
                    // (a, b, c) now is the random vector uniformly distributed on a unit
                    // sphere
                    v = sqrt(1 - 1 / (gamma * gamma));
                    a = v * a; // vx'
                    b = v * b; // vy'
                    c = v * c; // vz'
                    // Lorentz transformation to lab reference frame
                    b = b*sqrt( 1 - v0*v0 )/( 1 + a*v0 );
                    c = c*sqrt( 1 - v0*v0 )/( 1 + a*v0 );
                    a = ( a + v0 )/( 1 + a*v0 );
                    double g = 1/sqrt( 1 - a*a - b*b - c*c );
                    tmp_p->ux = a*g*ux0/u0 - b*g*uy0/u0;
                    tmp_p->uy = a*g*uy0/u0 + b*g*ux0/u0;
                    tmp_p->uz = c*g;
                } else {
                    tmp_p->ux = ux0;
                    tmp_p->uy = uy0;
                    tmp_p->uz = 0;
                }
                if (cmr!=0)
                    tmp_p->g = sqrt(1 + (*tmp_p).ux*(*tmp_p).ux + (*tmp_p).uy*(*tmp_p).uy + (*tmp_p).uz*(*tmp_p).uz);
                else
                    tmp_p->g = sqrt((*tmp_p).ux*(*tmp_p).ux + (*tmp_p).uy*(*tmp_p).uy + (*tmp_p).uz*(*tmp_p).uz);
                #ifndef QUILL_NOQED
                tmp_p->chi = 0;
                #endif
                tmp_p->trn = 0;
                place(*tmp_p);
            }
        }
    }
    cp[a.i][a.j][a.k].pl.start = cp[a.i][a.j][a.k].pl.head;
}